

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

void P_DrawSplash2(int count,DVector3 *pos,DAngle *angle,int updown,int kind)

{
  particle_t *ppVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  WORD WVar7;
  particle_t *ppVar8;
  uint32 uVar9;
  uint uVar10;
  uint32 uVar11;
  uint uVar12;
  uint32 local_64;
  
  if (kind == 2) {
    local_64 = grey3;
    uVar9 = grey1;
  }
  else if (kind == 1) {
    local_64 = grey3;
    uVar9 = grey5;
  }
  else if (kind == 0) {
    local_64 = blood1;
    uVar9 = blood2;
  }
  else {
    local_64 = ParticleColor(kind);
    uVar9 = ParticleColor(((uint)kind >> 8 & 0xff) * 0xab >> 1 & 0x7f00 |
                          ((uint)kind >> 0x10 & 0xff) * 0x5580 & 0x7f0000 | (kind & 0xffU) / 3);
  }
  if (count != 0) {
    dVar2 = *(double *)(&DAT_00765830 + (ulong)(updown == 0) * 8);
    do {
      ppVar8 = Particles;
      WVar7 = InactiveParticles;
      if (InactiveParticles == 0xffff) {
        return;
      }
      uVar6 = (ulong)InactiveParticles;
      ppVar1 = Particles + uVar6;
      InactiveParticles = Particles[uVar6].tnext;
      Particles[uVar6].tnext = ActiveParticles;
      ActiveParticles = WVar7;
      ppVar8[uVar6].ttl = '\f';
      ppVar8[uVar6].trans = 0xff;
      ppVar8[uVar6].fade = '\x15';
      ppVar8[uVar6].size = 4.0;
      uVar10 = FRandom::GenRand32(&M_Random);
      uVar11 = local_64;
      if (-1 < (char)uVar10) {
        uVar11 = uVar9;
      }
      ppVar8[uVar6].color = uVar11;
      uVar10 = FRandom::GenRand32(&M_Random);
      ppVar8[uVar6].Vel.Z = (double)(uVar10 & 0xff) * -0.001953125;
      ppVar8[uVar6].Acc.Z = -0.045454545454545456;
      if (kind != 0) {
        uVar10 = FRandom::GenRand32(&M_Random);
        dVar3 = angle->Degrees;
        uVar12 = FRandom::GenRand32(&M_Random);
        dVar3 = FFastTrig::cos(&fasttrig,
                               ((double)(int)((uVar10 & 0xff) - 0x80) * 0.703125 + dVar3) *
                               11930464.711111112 + 6755399441055744.0);
        (ppVar1->Vel).X = dVar3 * (double)(uVar12 & 0xff) * 0.00048828125;
        uVar10 = FRandom::GenRand32(&M_Random);
        dVar3 = FFastTrig::sin(&fasttrig,(double)(uVar10 & 0xff));
        dVar3 = dVar3 * (double)(uVar10 & 0xff) * 0.00048828125;
        (ppVar1->Vel).Y = dVar3;
        (ppVar1->Acc).X = (ppVar1->Vel).X * 0.0625;
        (ppVar1->Acc).Y = dVar3 * 0.0625;
      }
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar3 = angle->Degrees;
      dVar4 = pos->X;
      uVar12 = FRandom::GenRand32(&M_Random);
      dVar3 = FFastTrig::cos(&fasttrig,
                             ((double)(int)((uVar10 & 0xff) - 0x80) * 0.3515625 + dVar3) *
                             11930464.711111112 + 6755399441055744.0);
      (ppVar1->Pos).X = dVar3 * (double)(int)((uVar12 & 0x1f) - 0xf) + dVar4;
      dVar3 = pos->Y;
      uVar10 = FRandom::GenRand32(&M_Random);
      dVar4 = (double)(int)((uVar10 & 0x1f) - 0xf);
      dVar5 = FFastTrig::sin(&fasttrig,dVar4);
      (ppVar1->Pos).Y = dVar5 * dVar4 + dVar3;
      dVar3 = pos->Z;
      uVar10 = FRandom::GenRand32(&M_Random);
      (ppVar1->Pos).Z =
           (double)(int)((uVar10 & 0xff) + (updown != 2 | 0xfffffffe) * 0x80) * dVar2 + dVar3;
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void P_DrawSplash2 (int count, const DVector3 &pos, DAngle angle, int updown, int kind)
{
	int color1, color2, zadd;
	double zvel, zspread;

	switch (kind)
	{
	case 0:		// Blood
		color1 = blood1;
		color2 = blood2;
		break;
	case 1:		// Gunshot
		color1 = grey3;
		color2 = grey5;
		break;
	case 2:		// Smoke
		color1 = grey3;
		color2 = grey1;
		break;
	default:	// colorized blood
		color1 = ParticleColor(kind);
		color2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
		break;
	}

	zvel = -1./512.;
	zspread = updown ? -6000 / 65536. : 6000 / 65536.;
	zadd = (updown == 2) ? -128 : 0;

	for (; count; count--)
	{
		particle_t *p = NewParticle ();
		DAngle an;

		if (!p)
			break;

		p->ttl = 12;
		p->fade = FADEFROMTTL(12);
		p->trans = 255;
		p->size = 4;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z = M_Random() * zvel;
		p->Acc.Z = -1 / 22.;
		if (kind) 
		{
			an = angle + ((M_Random() - 128) * (180 / 256.));
			p->Vel.X = M_Random() * an.Cos() / 2048.;
			p->Vel.Y = M_Random() * an.Sin() / 2048.;
			p->Acc.X = p->Vel.X / 16.;
			p->Acc.Y = p->Vel.Y / 16.;
		}
		an = angle + ((M_Random() - 128) * (90 / 256.));
		p->Pos.X = pos.X + ((M_Random() & 31) - 15) * an.Cos();
		p->Pos.Y = pos.Y + ((M_Random() & 31) - 15) * an.Sin();
		p->Pos.Z = pos.Z + (M_Random() + zadd - 128) * zspread;
	}
}